

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall QComboBox::initStyleOption(QComboBox *this,QStyleOptionComboBox *option)

{
  bool bVar1;
  uint value;
  QComboBoxPrivate *widget;
  ulong uVar2;
  QSize QVar3;
  QComboBoxPrivate *in_RSI;
  QIcon *in_RDI;
  long in_FS_OFFSET;
  QComboBoxPrivate *d;
  QVariant alignment;
  QString *in_stack_ffffffffffffff38;
  SubControl flags;
  QComboBox *in_stack_ffffffffffffff40;
  QAbstractItemModel *this_00;
  QFlag QVar4;
  QComboBoxPrivate *index;
  QFlag local_90;
  undefined4 local_8c;
  QPersistentModelIndex local_88 [3];
  QPersistentModelIndex local_70 [3];
  QIcon local_58 [4];
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  anon_union_24_3_e3d07ef4_for_data local_28;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != (QComboBoxPrivate *)0x0) {
    widget = d_func((QComboBox *)0x536677);
    QStyleOption::initFrom((QStyleOption *)in_RSI,(QWidget *)widget);
    bVar1 = isEditable(in_stack_ffffffffffffff40);
    (in_RSI->super_QWidgetPrivate).field_0x48 = bVar1;
    (in_RSI->super_QWidgetPrivate).field_0x5c = (byte)widget->field_0x34c >> 2 & 1;
    bVar1 = QWidget::hasFocus((QWidget *)in_RSI);
    if ((bVar1) && (((in_RSI->super_QWidgetPrivate).field_0x48 & 1) == 0)) {
      QFlags<QStyle::StateFlag>::operator|=
                ((State *)&(in_RSI->super_QWidgetPrivate).field_0x8,State_Selected);
    }
    QFlags<QStyle::SubControl>::QFlags
              ((QFlags<QStyle::SubControl> *)in_stack_ffffffffffffff40,
               (SubControl)((ulong)in_stack_ffffffffffffff38 >> 0x20));
    *(undefined4 *)&(in_RSI->super_QWidgetPrivate).field_0x40 = local_2c;
    flags = (SubControl)((ulong)in_stack_ffffffffffffff38 >> 0x20);
    if (widget->arrowState == State_Sunken) {
      QFlags<QStyle::SubControl>::QFlags
                ((QFlags<QStyle::SubControl> *)in_stack_ffffffffffffff40,flags);
      *(undefined4 *)&(in_RSI->super_QWidgetPrivate).field_0x44 = local_30;
      QFlags<QStyle::StateFlag>::operator|=
                ((State *)&(in_RSI->super_QWidgetPrivate).field_0x8,widget->arrowState);
    }
    else {
      QFlags<QStyle::SubControl>::QFlags
                ((QFlags<QStyle::SubControl> *)in_stack_ffffffffffffff40,flags);
      *(undefined4 *)&(in_RSI->super_QWidgetPrivate).field_0x44 = local_34;
    }
    currentText((QComboBox *)in_RSI);
    QString::operator=((QString *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    QString::~QString((QString *)0x5367aa);
    uVar2 = QPersistentModelIndex::isValid();
    if ((uVar2 & 1) != 0) {
      index = widget;
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_70);
      QComboBoxPrivate::itemIcon(in_RSI,(QModelIndex *)index);
      QIcon::operator=((QIcon *)index,in_RDI);
      QIcon::~QIcon(local_58);
      local_28.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
      local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_28._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      this_00 = index->model;
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_88);
      (**(code **)(*(long *)this_00 + 0x90))(&local_28,this_00,local_88,7);
      bVar1 = ::QVariant::isValid((QVariant *)this_00);
      QVar4.i = (int)((ulong)this_00 >> 0x20);
      if (bVar1) {
        value = ::QVariant::toUInt((bool *)local_28.data);
        QFlag::QFlag(&local_90,value);
        QFlags<Qt::AlignmentFlag>::QFlagsStorageHelper((QFlags<Qt::AlignmentFlag> *)widget,QVar4);
        *(undefined4 *)&(in_RSI->super_QWidgetPrivate).focus_prev = local_8c;
      }
      widget = index;
      ::QVariant::~QVariant((QVariant *)&local_28);
    }
    QVar3 = iconSize((QComboBox *)widget);
    (in_RSI->super_QWidgetPrivate).focus_next = (QWidget *)QVar3;
    bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QComboBoxPrivateContainer> *)0x536921);
    if (bVar1) {
      QPointer<QComboBoxPrivateContainer>::operator->
                ((QPointer<QComboBoxPrivateContainer> *)0x536938);
      bVar1 = QWidget::isVisible((QWidget *)0x536940);
      if (bVar1) {
        QFlags<QStyle::StateFlag>::operator|=
                  ((State *)&(in_RSI->super_QWidgetPrivate).field_0x8,State_On);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QComboBox::initStyleOption(QStyleOptionComboBox *option) const
{
    if (!option)
        return;

    Q_D(const QComboBox);
    option->initFrom(this);
    option->editable = isEditable();
    option->frame = d->frame;
    if (hasFocus() && !option->editable)
        option->state |= QStyle::State_Selected;
    option->subControls = QStyle::SC_All;
    if (d->arrowState == QStyle::State_Sunken) {
        option->activeSubControls = QStyle::SC_ComboBoxArrow;
        option->state |= d->arrowState;
    } else {
        option->activeSubControls = d->hoverControl;
    }
    option->currentText = currentText();
    if (d->currentIndex.isValid()) {
        option->currentIcon = d->itemIcon(d->currentIndex);
        QVariant alignment = d->model->data(d->currentIndex, Qt::TextAlignmentRole);
        if (alignment.isValid())
            option->textAlignment = static_cast<Qt::Alignment>(alignment.toUInt());
    }
    option->iconSize = iconSize();
    if (d->container && d->container->isVisible())
        option->state |= QStyle::State_On;
}